

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O2

void Saig_StrSimSetContiguousMatching_rec(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  ulong uVar2;
  Aig_Obj_t *pObj_00;
  uint uVar3;
  
  while( true ) {
    while( true ) {
      if (pObj->TravId == p->nTravIds) {
        return;
      }
      pObj->TravId = p->nTravIds;
      iVar1 = Saig_ObjIsPo(p,pObj);
      if (iVar1 != 0) {
        return;
      }
      iVar1 = Saig_ObjIsLi(p,pObj);
      if (iVar1 == 0) break;
      pObj = Saig_ObjLiToLo(p,pObj);
    }
    uVar2 = *(ulong *)&pObj->field_0x18;
    if ((((uint)uVar2 & 7) != 2) && (((uint)uVar2 & 7) - 7 < 0xfffffffe)) {
      __assert_fail("Aig_ObjIsCi(pObj) || Aig_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigStrSim.c"
                    ,0x28d,"void Saig_StrSimSetContiguousMatching_rec(Aig_Man_t *, Aig_Obj_t *)");
    }
    if (p->pReprs == (Aig_Obj_t **)0x0) {
      return;
    }
    if (p->pReprs[pObj->Id] == (Aig_Obj_t *)0x0) break;
    if (p->pFanData == (int *)0x0) {
      __assert_fail("p->pFanData",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigStrSim.c"
                    ,0x291,"void Saig_StrSimSetContiguousMatching_rec(Aig_Man_t *, Aig_Obj_t *)");
    }
    iVar1 = -1;
    for (uVar3 = 0; uVar3 < ((uint)(uVar2 >> 6) & 0x3ffffff); uVar3 = uVar3 + 1) {
      if (uVar3 == 0) {
        iVar1 = Aig_ObjFanout0Int(p,pObj->Id);
      }
      else {
        iVar1 = Aig_ObjFanoutNext(p,iVar1);
      }
      pObj_00 = Aig_ManObj(p,iVar1 >> 1);
      Saig_StrSimSetContiguousMatching_rec(p,pObj_00);
      uVar2 = *(ulong *)&pObj->field_0x18;
    }
    if (((uint)uVar2 & 7) == 2) {
      return;
    }
    Saig_StrSimSetContiguousMatching_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe))
    ;
    pObj = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
  }
  return;
}

Assistant:

void Saig_StrSimSetContiguousMatching_rec( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    Aig_Obj_t * pFanout;
    int i, iFanout = -1;
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Saig_ObjIsPo( p, pObj ) )
        return;
    if ( Saig_ObjIsLi( p, pObj ) )
    {
        Saig_StrSimSetContiguousMatching_rec( p, Saig_ObjLiToLo(p, pObj) );
        return;
    }
    assert( Aig_ObjIsCi(pObj) || Aig_ObjIsNode(pObj) );
    if ( Aig_ObjRepr(p, pObj) == NULL )
        return;
    // go through the fanouts
    Aig_ObjForEachFanout( p, pObj, pFanout, iFanout, i )
        Saig_StrSimSetContiguousMatching_rec( p, pFanout );
    // go through the fanins
    if ( !Aig_ObjIsCi( pObj ) )
    {
        Saig_StrSimSetContiguousMatching_rec( p, Aig_ObjFanin0(pObj) );
        Saig_StrSimSetContiguousMatching_rec( p, Aig_ObjFanin1(pObj) );
    }
}